

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O3

StringRef llvm::dwarf::AttributeValueString(uint16_t Attr,uint Val)

{
  StringRef SVar1;
  StringRef SVar2;
  StringRef SVar3;
  StringRef SVar4;
  StringRef SVar5;
  StringRef SVar6;
  StringRef SVar7;
  char *pcVar8;
  ulong uVar9;
  undefined *puVar10;
  int iVar11;
  undefined6 in_register_0000003a;
  StringRef SVar12;
  
  iVar11 = (int)CONCAT62(in_register_0000003a,Attr);
  if (iVar11 < 0x3e) {
    if (iVar11 < 0x20) {
      if (iVar11 == 9) {
        if (Val == 1) {
          SVar12.Length = 0x10;
          SVar12.Data = "DW_ORD_col_major";
          return SVar12;
        }
        if (Val != 0) {
          return (StringRef)ZEXT816(0);
        }
        SVar7.Length = 0x10;
        SVar7.Data = "DW_ORD_row_major";
        return SVar7;
      }
      if (iVar11 == 0x13) {
LAB_00d41ede:
        SVar12 = LanguageString(Val);
        return SVar12;
      }
      if (iVar11 != 0x17) {
        return (StringRef)ZEXT816(0);
      }
      if (2 < Val - 1) {
        return (StringRef)ZEXT816(0);
      }
      uVar9 = (ulong)(Val - 1);
      pcVar8 = (&PTR_anon_var_dwarf_3fa2417_01077cf8)[uVar9];
      puVar10 = &DAT_00e51a38;
    }
    else if (iVar11 == 0x20) {
      if (3 < Val) {
        return (StringRef)ZEXT816(0);
      }
      uVar9 = (ulong)Val;
      pcVar8 = (&PTR_anon_var_dwarf_3fad23e_01077d30)[uVar9];
      puVar10 = &DAT_00e55e38;
    }
    else {
      if (iVar11 != 0x32) {
        if (iVar11 != 0x36) {
          return (StringRef)ZEXT816(0);
        }
        SVar12 = ConventionString(Val);
        return SVar12;
      }
      if (2 < Val - 1) {
        return (StringRef)ZEXT816(0);
      }
      uVar9 = (ulong)(Val - 1);
      pcVar8 = (&PTR_anon_var_dwarf_3fa23cf_01077ca0)[uVar9];
      puVar10 = &DAT_00e519e0;
    }
  }
  else if (iVar11 < 0x5e) {
    if (iVar11 == 0x3e) {
      SVar12 = AttributeEncodingString(Val);
      return SVar12;
    }
    if (iVar11 == 0x42) {
      if (3 < Val) {
        return (StringRef)ZEXT816(0);
      }
      uVar9 = (ulong)Val;
      pcVar8 = (&PTR_anon_var_dwarf_3fad0ca_01077d10)[uVar9];
      puVar10 = &DAT_00e55e18;
    }
    else {
      if (iVar11 != 0x4c) {
        return (StringRef)ZEXT816(0);
      }
      if (2 < Val) {
        return (StringRef)ZEXT816(0);
      }
      uVar9 = (ulong)Val;
      pcVar8 = (&PTR_anon_var_dwarf_3fa243b_01077cb8)[uVar9];
      puVar10 = &DAT_00e519f8;
    }
  }
  else if (iVar11 < 0x8b) {
    if (iVar11 != 0x5e) {
      if (iVar11 != 0x65) {
        return (StringRef)ZEXT816(0);
      }
      if ((int)Val < 2) {
        if (Val == 0) {
          SVar5.Length = 0xe;
          SVar5.Data = "DW_END_default";
          return SVar5;
        }
        if (Val != 1) {
          return (StringRef)ZEXT816(0);
        }
        SVar4.Length = 10;
        SVar4.Data = "DW_END_big";
        return SVar4;
      }
      if (Val == 2) {
        SVar3.Length = 0xd;
        SVar3.Data = "DW_END_little";
        return SVar3;
      }
      if (Val != 0x40) {
        if (Val != 0xff) {
          return (StringRef)ZEXT816(0);
        }
        SVar1.Length = 0xe;
        SVar1.Data = "DW_END_hi_user";
        return SVar1;
      }
      SVar2.Length = 0xe;
      SVar2.Data = "DW_END_lo_user";
      return SVar2;
    }
    if (4 < Val - 1) {
      return (StringRef)ZEXT816(0);
    }
    uVar9 = (ulong)(Val - 1);
    pcVar8 = (&PTR_anon_var_dwarf_3fa235f_01077cd0)[uVar9];
    puVar10 = &DAT_00e51a10;
  }
  else {
    if (iVar11 != 0x8b) {
      if (iVar11 != 0x3fe6) {
        return (StringRef)ZEXT816(0);
      }
      goto LAB_00d41ede;
    }
    if (2 < Val) {
      return (StringRef)ZEXT816(0);
    }
    uVar9 = (ulong)Val;
    pcVar8 = (&PTR_anon_var_dwarf_3fa23f3_01077d50)[uVar9];
    puVar10 = &DAT_00e51a50;
  }
  SVar6.Length = *(size_t *)(puVar10 + uVar9 * 8);
  SVar6.Data = pcVar8;
  return SVar6;
}

Assistant:

StringRef llvm::dwarf::AttributeValueString(uint16_t Attr, unsigned Val) {
  switch (Attr) {
  case DW_AT_accessibility:
    return AccessibilityString(Val);
  case DW_AT_virtuality:
    return VirtualityString(Val);
  case DW_AT_language:
    return LanguageString(Val);
  case DW_AT_encoding:
    return AttributeEncodingString(Val);
  case DW_AT_decimal_sign:
    return DecimalSignString(Val);
  case DW_AT_endianity:
    return EndianityString(Val);
  case DW_AT_visibility:
    return VisibilityString(Val);
  case DW_AT_identifier_case:
    return CaseString(Val);
  case DW_AT_calling_convention:
    return ConventionString(Val);
  case DW_AT_inline:
    return InlineCodeString(Val);
  case DW_AT_ordering:
    return ArrayOrderString(Val);
  case DW_AT_APPLE_runtime_class:
    return LanguageString(Val);
  case DW_AT_defaulted:
    return DefaultedMemberString(Val);
  }

  return StringRef();
}